

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

int __thiscall QMakeProperty::setProperty(QMakeProperty *this,QStringList *optionProperties)

{
  bool bVar1;
  undefined1 uVar2;
  const_iterator o;
  const_iterator o_00;
  QString *in_RSI;
  QMakeProperty *in_RDI;
  long in_FS_OFFSET;
  QString var;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QMakeProperty *this_00;
  int local_5c;
  char *in_stack_ffffffffffffffa8;
  undefined1 local_40 [24];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QString *)0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_10 = QList<QString>::cbegin((QList<QString> *)in_RDI);
  while( true ) {
    o = QList<QString>::cend((QList<QString> *)in_RDI);
    bVar1 = QList<QString>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::const_iterator::operator*(&local_10);
    QString::QString((QString *)in_RDI,
                     (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QList<QString>::const_iterator::operator++(&local_10);
    o_00 = QList<QString>::cend((QList<QString> *)in_RDI);
    bVar1 = QList<QString>::const_iterator::operator==(&local_10,o_00);
    if (bVar1) {
      local_5c = 0x65;
      in_stack_ffffffffffffff7c = 1;
    }
    else {
      QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffffa8);
      uVar2 = QString::startsWith((QString *)&local_28,(CaseSensitivity)local_40);
      in_stack_ffffffffffffff6c = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff6c) ^ 0xff000000;
      QString::~QString((QString *)0x3358d7);
      if ((in_stack_ffffffffffffff6c & 0x1000000) != 0) {
        QString::QString((QString *)in_RDI,
                         (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        QList<QString>::const_iterator::operator*(&local_10);
        setValue(this_00,in_RSI,o.i);
        QString::~QString((QString *)0x335919);
      }
      in_stack_ffffffffffffff7c = 0;
    }
    QString::~QString((QString *)0x33592b);
    if (in_stack_ffffffffffffff7c != 0) goto LAB_00335953;
    QList<QString>::const_iterator::operator++(&local_10);
  }
  local_5c = 0;
LAB_00335953:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_5c;
}

Assistant:

int QMakeProperty::setProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        ++it;
        if (it == optionProperties.cend()) {
            return PropFailRetCode;
        }
        if (!var.startsWith("."))
            setValue(var, (*it));
    }
    return PropSuccessRetCode;
}